

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int ptls_hkdf_expand(ptls_hash_algorithm_t *algo,void *output,size_t outlen,ptls_iovec_t prk,
                    ptls_iovec_t info)

{
  ptls_hash_context_t *ppVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  uint8_t gen;
  uint8_t digest [64];
  undefined1 local_91;
  uint8_t *local_90;
  size_t local_88;
  void *local_80;
  undefined1 local_78 [72];
  
  local_88 = prk.len;
  local_90 = prk.base;
  local_80 = output;
  if (outlen != 0) {
    sVar2 = algo->digest_size;
    lVar5 = 1;
    ppVar1 = (st_ptls_hash_context_t *)0x0;
    do {
      if (ppVar1 == (st_ptls_hash_context_t *)0x0) {
        ppVar1 = ptls_hmac_create(algo,local_90,local_88);
        if (ppVar1 == (ptls_hash_context_t *)0x0) {
          return 0x201;
        }
      }
      else {
        (*ppVar1->update)(ppVar1,local_78,sVar2);
      }
      (*ppVar1->update)(ppVar1,info.base,info.len);
      local_91 = (undefined1)lVar5;
      (*ppVar1->update)(ppVar1,&local_91,1);
      (*ppVar1->final)(ppVar1,local_78,PTLS_HASH_FINAL_MODE_RESET);
      lVar4 = (lVar5 + -1) * algo->digest_size;
      uVar3 = algo->digest_size + lVar4;
      if (outlen <= uVar3) {
        uVar3 = outlen;
      }
      memcpy((void *)((long)local_80 + lVar4),local_78,uVar3 - lVar4);
      sVar2 = algo->digest_size;
      uVar3 = sVar2 * lVar5;
      lVar5 = lVar5 + 1;
    } while (uVar3 < outlen);
    (*ppVar1->final)(ppVar1,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
  }
  (*ptls_clear_memory)(local_78,algo->digest_size);
  return 0;
}

Assistant:

int ptls_hkdf_expand(ptls_hash_algorithm_t *algo, void *output, size_t outlen, ptls_iovec_t prk, ptls_iovec_t info)
{
    ptls_hash_context_t *hmac = NULL;
    size_t i;
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];

    for (i = 0; (i * algo->digest_size) < outlen; ++i) {
        if (hmac == NULL) {
            if ((hmac = ptls_hmac_create(algo, prk.base, prk.len)) == NULL)
                return PTLS_ERROR_NO_MEMORY;
        } else {
            hmac->update(hmac, digest, algo->digest_size);
        }
        hmac->update(hmac, info.base, info.len);
        uint8_t gen = (uint8_t)(i + 1);
        hmac->update(hmac, &gen, 1);
        hmac->final(hmac, digest, 1);

        size_t off_start = i * algo->digest_size, off_end = off_start + algo->digest_size;
        if (off_end > outlen)
            off_end = outlen;
        memcpy((uint8_t *)output + off_start, digest, off_end - off_start);
    }

    if (hmac != NULL)
        hmac->final(hmac, NULL, PTLS_HASH_FINAL_MODE_FREE);

    ptls_clear_memory(digest, algo->digest_size);

    return 0;
}